

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O0

void __thiscall
DnsStats::RegisterDnssecUsageByPrefix
          (DnsStats *this,BinHash<DnssecPrefixEntry> *dnssecTable,uint8_t *prefix,
          size_t prefix_length,bool is_dnssec)

{
  bool local_61;
  undefined1 local_60 [7];
  bool stored;
  DnssecPrefixEntry dpe;
  bool is_dnssec_local;
  size_t prefix_length_local;
  uint8_t *prefix_local;
  BinHash<DnssecPrefixEntry> *dnssecTable_local;
  DnsStats *this_local;
  
  dpe.prefix_data._7_1_ = is_dnssec;
  DnssecPrefixEntry::DnssecPrefixEntry((DnssecPrefixEntry *)local_60);
  local_61 = false;
  dpe.prefix_len._0_1_ = dpe.prefix_data._7_1_ & 1;
  dpe._8_8_ = prefix;
  dpe.prefix = (uint8_t *)prefix_length;
  BinHash<DnssecPrefixEntry>::InsertOrAdd(dnssecTable,(DnssecPrefixEntry *)local_60,true,&local_61);
  DnssecPrefixEntry::~DnssecPrefixEntry((DnssecPrefixEntry *)local_60);
  return;
}

Assistant:

void DnsStats::RegisterDnssecUsageByPrefix(
    BinHash<DnssecPrefixEntry> * dnssecTable,
    uint8_t * prefix, size_t prefix_length, bool is_dnssec)
{
    DnssecPrefixEntry dpe;
    bool stored = false;

    dpe.prefix = prefix;
    dpe.prefix_len = prefix_length;
    dpe.is_dnssec = is_dnssec;

    dnssecTable->InsertOrAdd(&dpe, true, &stored);
}